

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PcacheSetPageSize(PCache *pCache,int szPage)

{
  int iVar1;
  sqlite3_pcache *psVar2;
  
  if (pCache->szPage != 0) {
    psVar2 = (*sqlite3Config.pcache2.xCreate)
                       (szPage,pCache->szExtra + 0x48,(uint)pCache->bPurgeable);
    if (psVar2 == (sqlite3_pcache *)0x0) {
      return 7;
    }
    iVar1 = pCache->szCache;
    if ((long)iVar1 < 0) {
      iVar1 = (int)(((long)iVar1 * -0x400) / ((long)pCache->szExtra + (long)pCache->szPage));
    }
    (*sqlite3Config.pcache2.xCachesize)(psVar2,iVar1);
    if (pCache->pCache != (sqlite3_pcache *)0x0) {
      (*sqlite3Config.pcache2.xDestroy)(pCache->pCache);
    }
    pCache->pCache = psVar2;
    pCache->szPage = szPage;
    if (psVar2 == (sqlite3_pcache *)0x0) {
      return 7;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3PcacheSetPageSize(PCache *pCache, int szPage){
  assert( pCache->nRefSum==0 && pCache->pDirty==0 );
  if( pCache->szPage ){
    sqlite3_pcache *pNew;
    pNew = sqlite3GlobalConfig.pcache2.xCreate(
                szPage, pCache->szExtra + ROUND8(sizeof(PgHdr)),
                pCache->bPurgeable
    );
    if( pNew==0 ) return SQLITE_NOMEM_BKPT;
    sqlite3GlobalConfig.pcache2.xCachesize(pNew, numberOfCachePages(pCache));
    if( pCache->pCache ){
      sqlite3GlobalConfig.pcache2.xDestroy(pCache->pCache);
    }
    pCache->pCache = pNew;
    pCache->szPage = szPage;
    pcacheTrace(("%p.PAGESIZE %d\n",pCache,szPage));
  }
  return SQLITE_OK;
}